

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkTypeAsFullyUsed
          (EliminateDeadMembersPass *this,uint32_t type_id)

{
  value_type_conflict vVar1;
  Op OVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  mapped_type *this_01;
  value_type_conflict local_24;
  Instruction *pIStack_20;
  uint32_t i;
  Instruction *type_inst;
  EliminateDeadMembersPass *pEStack_10;
  uint32_t type_id_local;
  EliminateDeadMembersPass *this_local;
  
  type_inst._4_4_ = type_id;
  pEStack_10 = this;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  pIStack_20 = analysis::DefUseManager::GetDef(this_00,type_inst._4_4_);
  if (pIStack_20 == (Instruction *)0x0) {
    __assert_fail("type_inst != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x93,
                  "void spvtools::opt::EliminateDeadMembersPass::MarkTypeAsFullyUsed(uint32_t)");
  }
  OVar2 = opt::Instruction::opcode(pIStack_20);
  if (OVar2 - OpTypeArray < 2) {
    uVar3 = opt::Instruction::GetSingleWordInOperand(pIStack_20,0);
    MarkTypeAsFullyUsed(this,uVar3);
  }
  else if (OVar2 == OpTypeStruct) {
    for (local_24 = 0; vVar1 = local_24, uVar3 = opt::Instruction::NumInOperands(pIStack_20),
        vVar1 < uVar3; local_24 = local_24 + 1) {
      this_01 = std::
                unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                ::operator[](&this->used_members_,(key_type *)((long)&type_inst + 4));
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (this_01,&local_24);
      uVar3 = opt::Instruction::GetSingleWordInOperand(pIStack_20,local_24);
      MarkTypeAsFullyUsed(this,uVar3);
    }
  }
  return;
}

Assistant:

void EliminateDeadMembersPass::MarkTypeAsFullyUsed(uint32_t type_id) {
  Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
  assert(type_inst != nullptr);

  switch (type_inst->opcode()) {
    case spv::Op::OpTypeStruct:
      // Mark every member and its type as fully used.
      for (uint32_t i = 0; i < type_inst->NumInOperands(); ++i) {
        used_members_[type_id].insert(i);
        MarkTypeAsFullyUsed(type_inst->GetSingleWordInOperand(i));
      }
      break;
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
      MarkTypeAsFullyUsed(
          type_inst->GetSingleWordInOperand(kArrayElementTypeIdx));
      break;
    default:
      break;
  }
}